

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_slice.c
# Opt level: O3

h264_macroblock * h264_mb_nb(h264_slice *slice,h264_mb_pos pos,int inter)

{
  uint uVar1;
  h264_macroblock *phVar2;
  h264_macroblock *phVar3;
  
  phVar2 = h264_mb_nb_p(slice,pos,inter);
  if (pos != H264_MB_THIS) {
    uVar1 = slice->curr_mb_addr;
    phVar3 = slice->mbs + uVar1;
    if (pos == H264_MB_B) {
      if (slice->mbaff_frame_flag != 0) {
        if (phVar3->mb_field_decoding_flag == 0) {
          if ((uVar1 & 1) == 0) {
            if (phVar2->mb_type != 0x39) {
              phVar2 = phVar2 + 1;
            }
          }
          else {
            phVar2 = phVar3 + -1;
          }
        }
        else if ((phVar2->mb_type != 0x39) &&
                (((uVar1 & 1) != 0 || (phVar2->mb_field_decoding_flag == 0)))) {
          phVar2 = phVar2 + 1;
        }
      }
    }
    else {
      if (pos != H264_MB_A) {
        abort();
      }
      if (((slice->mbaff_frame_flag != 0) && ((uVar1 & 1) != 0 && phVar2->mb_type != 0x39)) &&
         (phVar2->mb_field_decoding_flag == phVar3->mb_field_decoding_flag)) {
        phVar2 = phVar2 + 1;
      }
    }
  }
  return phVar2;
}

Assistant:

const struct h264_macroblock *h264_mb_nb(struct h264_slice *slice, enum h264_mb_pos pos, int inter) {
	const struct h264_macroblock *mbp = h264_mb_nb_p(slice, pos, inter);
	const struct h264_macroblock *mbt = &slice->mbs[slice->curr_mb_addr];
	switch (pos) {
		case H264_MB_THIS:
			return mbp;
		case H264_MB_A:
			/* to the left */
			/* if not MBAFF - simply use mbp */
			/* if MBAFF and mbp not available - just pass mbp */
			/* if MBAFF and mbp available and frame/field coding differs - use mbp[0] */
			/* if MBAFF and mbp available and frame/field coding same - use mbp[curr_mb & 1] */
			if (slice->mbaff_frame_flag
					&& mbp->mb_type != H264_MB_TYPE_UNAVAIL
					&& (slice->curr_mb_addr & 1)
					&& mbp->mb_field_decoding_flag == mbt->mb_field_decoding_flag)
				return mbp + 1;
			return mbp;
		case H264_MB_B:
			if (slice->mbaff_frame_flag) {
				if (mbt->mb_field_decoding_flag) {
					/* MBAFF and in field mb */
					if (mbp->mb_type == H264_MB_TYPE_UNAVAIL)
						return mbp;
					/* MBAFF and in field mb, with mb pair above available */
					/* if above mb pair is frame coded, use bottom mb */
					/* if above is field coded, use mb of same parity */
					if (!(slice->curr_mb_addr & 1)
							&& mbp->mb_field_decoding_flag)
						return mbp;
					else
						return mbp+1;
				} else {
					/* MBAFF and in frame mb */
					/* if in bottom mb of the pair, use the top mb */
					if (slice->curr_mb_addr & 1)
						return mbt-1;
					/* otherwise, use the bottom mb of the above pair, whether field or frame */
					else if (mbp->mb_type != H264_MB_TYPE_UNAVAIL)
						return mbp+1;
					else
						return mbp;
				}
			}
			return mbp;
		default:
			abort();
	}
}